

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::Arena::Init(Arena *this)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  LogMessage *pLVar4;
  undefined8 uVar5;
  long *in_FS_OFFSET;
  LogFinisher local_51;
  LogMessage local_50;
  
  LOCK();
  UNLOCK();
  lVar3 = lifecycle_id_generator_ + 1;
  *(long *)this = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar3;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (Arena)0x1;
  if ((*(long *)(this + 0x50) != 0) && (*(ulong *)(this + 0x58) != 0)) {
    if (*(ulong *)(this + 0x58) < 0x20) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x46);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,": Initial block size too small for header.")
      ;
      internal::LogFinisher::operator=(&local_51,pLVar4);
      internal::LogMessage::~LogMessage(&local_50);
    }
    plVar1 = *(long **)(this + 0x50);
    plVar1[3] = *(long *)(this + 0x58);
    plVar1[2] = 0x20;
    plVar1[1] = 0;
    puVar2 = (undefined8 *)*in_FS_OFFSET;
    *plVar1 = (long)puVar2;
    puVar2[1] = plVar1;
    *puVar2 = *(undefined8 *)this;
    plVar1[1] = *(long *)(this + 8);
    *(long **)(this + 8) = plVar1;
    if (plVar1[3] != plVar1[2]) {
      *(long **)(this + 0x10) = plVar1;
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + plVar1[3];
    this[0x28] = (Arena)0x0;
  }
  if (*(code **)(this + 0x70) == (code *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (**(code **)(this + 0x70))(this);
  }
  *(undefined8 *)(this + 0x38) = uVar5;
  return;
}

Assistant:

void Arena::Init() {
  lifecycle_id_ = lifecycle_id_generator_.GetNext();
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  owns_first_block_ = true;
  cleanup_list_ = 0;

  if (options_.initial_block != NULL && options_.initial_block_size > 0) {
    GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
        << ": Initial block size too small for header.";

    // Add first unowned block to list.
    Block* first_block = reinterpret_cast<Block*>(options_.initial_block);
    first_block->size = options_.initial_block_size;
    first_block->pos = kHeaderSize;
    first_block->next = NULL;
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
    owns_first_block_ = false;
  }

  // Call the initialization hook
  if (options_.on_arena_init != NULL) {
    hooks_cookie_ = options_.on_arena_init(this);
  } else {
    hooks_cookie_ = NULL;
  }
}